

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QUrl __thiscall QCborValue::toUrl(QCborValue *this,QUrl *defaultValue)

{
  QUrlPrivate *this_00;
  ByteData *this_01;
  QUrl *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView input;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = defaultValue[1].d;
  if (((this_00 == (QUrlPrivate *)0x0) || (*(int *)&defaultValue[2].d != 0x10020)) ||
     ((this_00->password).d.d != (Data *)0x2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QUrl::QUrl((QUrl *)this,in_RDX);
      return (QUrl)(QUrlPrivate *)this;
    }
  }
  else {
    this_01 = QCborContainerPrivate::byteData((QCborContainerPrivate *)this_00,1);
    if (this_01 == (ByteData *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QUrl::QUrl((QUrl *)this);
        return (QUrl)(QUrlPrivate *)this;
      }
    }
    else {
      QtCbor::ByteData::asByteArrayView((QByteArray *)&local_30,this_01);
      input.m_data = (storage_type *)local_30.size;
      input.m_size = (qsizetype)this;
      QUrl::fromEncoded(input,(ParsingMode)local_30.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return (QUrl)(QUrlPrivate *)this;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

QUrl QCborValue::toUrl(const QUrl &defaultValue) const
{
    if (!container || !isUrl() || container->elements.size() != 2)
        return defaultValue;

    Q_ASSERT(n == -1);
    const ByteData *byteData = container->byteData(1);
    if (!byteData)
        return QUrl();  // valid, empty URL

    return QUrl::fromEncoded(byteData->asByteArrayView());
}